

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

roaring64_bitmap_t * roaring64_bitmap_copy(roaring64_bitmap_t *r)

{
  roaring64_bitmap_t *r_00;
  container_t *container;
  leaf_t val;
  uint8_t result_typecode;
  art_iterator_t it;
  uint8_t local_b1;
  art_iterator_t local_b0;
  
  r_00 = (roaring64_bitmap_t *)roaring_malloc(0xb8);
  art_init_cleared((art_t *)r_00);
  r_00->flags = '\0';
  r_00->first_free = 0;
  r_00->capacity = 0;
  r_00->containers = (container_t **)0x0;
  art_init_iterator(&local_b0,&r->art,true);
  if (local_b0.value != (ulong *)0x0) {
    do {
      local_b1 = (uint8_t)*local_b0.value;
      container = get_copy_of_container(r->containers[*local_b0.value >> 8],&local_b1,false);
      val = add_container(r_00,container,local_b1);
      art_insert((art_t *)r_00,local_b0.key,val);
      art_iterator_next(&local_b0);
    } while (local_b0.value != (ulong *)0x0);
  }
  return r_00;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_copy(const roaring64_bitmap_t *r) {
    roaring64_bitmap_t *result = roaring64_bitmap_create();

    art_iterator_t it = art_init_iterator((art_t *)&r->art, /*first=*/true);
    while (it.value != NULL) {
        leaf_t leaf = (leaf_t)*it.value;
        uint8_t result_typecode = get_typecode(leaf);
        container_t *result_container = get_copy_of_container(
            get_container(r, leaf), &result_typecode, /*copy_on_write=*/false);
        leaf_t result_leaf =
            add_container(result, result_container, result_typecode);
        art_insert(&result->art, it.key, (art_val_t)result_leaf);
        art_iterator_next(&it);
    }
    return result;
}